

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall xmrig::Buffer::Buffer(Buffer *this,Buffer *other)

{
  char *__src;
  ulong __n;
  char *__dest;
  
  this->m_data = (char *)0x0;
  this->m_size = 0;
  __src = other->m_data;
  __n = other->m_size;
  __dest = (char *)operator_new__(__n);
  this->m_data = __dest;
  this->m_size = __n;
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

xmrig::Buffer::Buffer(const Buffer &other)
{
    copy(other.data(), other.size());
}